

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0452(SemanticModelTester *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  TypeKind TVar3;
  BasicTypeKind BVar4;
  int iVar5;
  EnumeratorDeclarationSyntax *pEVar6;
  MemberDeclarationSymbol *pMVar7;
  Lexeme *pLVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar10;
  undefined4 extraout_var_02;
  undefined8 uVar11;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [48];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"enum x { y , z } ;",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x10),"",&local_72);
  compile<psy::C::EnumDeclarationSyntax>((SemanticModelTester *)local_50,(string *)this,&local_70);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  std::__cxx11::string::~string((string *)&local_70);
  pp_Var1 = ((TestSuite *)(local_50._8_8_ + 0x28))->_vptr_TestSuite;
  pEVar6 = (EnumeratorDeclarationSyntax *)(**(code **)(**(long **)(pp_Var1[7] + 8) + 0x90))();
  pMVar7 = &SemanticModel::enumeratorFor((SemanticModel *)local_50._0_8_,pEVar6)->
            super_MemberDeclarationSymbol;
  if (pMVar7 == (MemberDeclarationSymbol *)0x0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar10 = std::operator<<(poVar10,"\t\tExpression is NOT ");
    poVar10 = std::operator<<(poVar10,"true");
    poVar10 = std::operator<<(poVar10,"\n");
    poVar10 = std::operator<<(poVar10,"\t\t");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    iVar5 = 0x34c;
  }
  else {
    pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_70,pLVar8);
    bVar2 = std::operator==(&local_70,"y");
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar2) {
      poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
      pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar8);
      poVar10 = std::operator<<(poVar10,(string *)&local_70);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
      poVar10 = std::operator<<(poVar10,"y");
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\t");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x34d);
      std::endl<char,std::char_traits<char>>(poVar10);
LAB_00390b14:
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_00390c96;
    }
    pTVar9 = MemberDeclarationSymbol::type(pMVar7);
    TVar3 = Type::kind(pTVar9);
    if (TVar3 == Basic) {
      pTVar9 = MemberDeclarationSymbol::type(pMVar7);
      iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar5));
      if (BVar4 == Int_S) {
        pEVar6 = (EnumeratorDeclarationSyntax *)
                 (**(code **)(**(long **)(*(long *)(pp_Var1[7] + 0x10) + 8) + 0x90))();
        pMVar7 = &SemanticModel::enumeratorFor((SemanticModel *)local_50._0_8_,pEVar6)->
                  super_MemberDeclarationSymbol;
        if (pMVar7 == (MemberDeclarationSymbol *)0x0) {
          poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar10 = std::operator<<(poVar10,"\t\tExpression is NOT ");
          poVar10 = std::operator<<(poVar10,"true");
          poVar10 = std::operator<<(poVar10,"\n");
          poVar10 = std::operator<<(poVar10,"\t\t");
          poVar10 = std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          iVar5 = 0x354;
        }
        else {
          pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_70,pLVar8);
          bVar2 = std::operator==(&local_70,"z");
          std::__cxx11::string::~string((string *)&local_70);
          if (!bVar2) {
            poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
            pLVar8 = &MemberDeclarationSymbol::name(pMVar7)->super_Lexeme;
            Lexeme::valueText_abi_cxx11_(&local_70,pLVar8);
            poVar10 = std::operator<<(poVar10,(string *)&local_70);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
            poVar10 = std::operator<<(poVar10,"z");
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\t");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x355);
            std::endl<char,std::char_traits<char>>(poVar10);
            goto LAB_00390b14;
          }
          pTVar9 = MemberDeclarationSymbol::type(pMVar7);
          TVar3 = Type::kind(pTVar9);
          if (TVar3 == Basic) {
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar5));
            if (BVar4 == Int_S) {
              return;
            }
            poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar5));
            poVar10 = C::operator<<(poVar10,BVar4);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
            poVar10 = C::operator<<(poVar10,Int_S);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\t");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            iVar5 = 0x357;
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar7);
            TVar3 = Type::kind(pTVar9);
            poVar10 = ::operator<<(poVar10,TVar3);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
            poVar10 = ::operator<<(poVar10,Basic);
            poVar10 = std::operator<<(poVar10,"\n");
            poVar10 = std::operator<<(poVar10,"\t\t");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            iVar5 = 0x356;
          }
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
        pTVar9 = MemberDeclarationSymbol::type(pMVar7);
        iVar5 = (*pTVar9->_vptr_Type[5])(pTVar9);
        BVar4 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar5));
        poVar10 = C::operator<<(poVar10,BVar4);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
        poVar10 = C::operator<<(poVar10,Int_S);
        poVar10 = std::operator<<(poVar10,"\n");
        poVar10 = std::operator<<(poVar10,"\t\t");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        iVar5 = 0x34f;
      }
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar10 = std::operator<<(poVar10,"\t\tActual  : ");
      pTVar9 = MemberDeclarationSymbol::type(pMVar7);
      TVar3 = Type::kind(pTVar9);
      poVar10 = ::operator<<(poVar10,TVar3);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\tExpected: ");
      poVar10 = ::operator<<(poVar10,Basic);
      poVar10 = std::operator<<(poVar10,"\n");
      poVar10 = std::operator<<(poVar10,"\t\t");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      iVar5 = 0x34e;
    }
  }
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar5);
  std::endl<char,std::char_traits<char>>(poVar10);
LAB_00390c96:
  uVar11 = __cxa_allocate_exception(1);
  __cxa_throw(uVar11,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0452()
{
    auto [tyDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y , z } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto enumeratorDecl0 = tySpec->declarations()->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym0 = semaModel->enumeratorFor(enumeratorDecl0);
    PSY_EXPECT_TRUE(enumeratorSym0);
    PSY_EXPECT_EQ_STR(enumeratorSym0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto enumeratorDecl1 = tySpec->declarations()->next->value->asEnumeratorDeclaration();

    const EnumeratorDeclarationSymbol* enumeratorSym1 = semaModel->enumeratorFor(enumeratorDecl1);
    PSY_EXPECT_TRUE(enumeratorSym1);
    PSY_EXPECT_EQ_STR(enumeratorSym1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(enumeratorSym1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}